

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg-traversal.h
# Opt level: O2

void __thiscall
wasm::
CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::
doEndReturn(CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
            *this,RelevantLiveLocalsWalker *self,Expression **currp)

{
  CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
  *this_00;
  CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
  *this_01;
  BasicBlock *__from;
  char *__to;
  char *__to_00;
  BasicBlock *lastExit;
  
  this_00 = (CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
             *)this->exit;
  this_01 = (CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
             *)this->currBasicBlock;
  this->currBasicBlock = (BasicBlock *)0x0;
  if (this_00 ==
      (CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
       *)0x0) {
    this->exit = (BasicBlock *)this_01;
  }
  else {
    if (this->hasSyntheticExit != false) {
      link(this_01,(char *)this_00,(char *)currp);
      return;
    }
    __from = makeBasicBlock(this);
    this->exit = __from;
    link(this_00,(char *)__from,__to);
    link(this_01,(char *)this->exit,__to_00);
    this->hasSyntheticExit = true;
  }
  return;
}

Assistant:

static void doEndReturn(SubType* self, Expression** currp) {
    auto* last = self->currBasicBlock;
    self->startUnreachableBlock();
    if (!self->exit) {
      // This is our first exit block and may be our only exit block, so just
      // set it.
      self->exit = last;
    } else if (!self->hasSyntheticExit) {
      // We now have multiple exit blocks, so we need to create a synthetic one.
      // It will be added to the list of basic blocks at the end of the
      // function.
      auto* lastExit = self->exit;
      self->exit = self->makeBasicBlock();
      self->link(lastExit, self->exit);
      self->link(last, self->exit);
      self->hasSyntheticExit = true;
    } else {
      // We already have a synthetic exit block. Just link it up.
      self->link(last, self->exit);
    }
  }